

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

int __thiscall libtorrent::aux::session_impl::next_port(session_impl *this)

{
  mutex *pmVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_40;
  
  pmVar1 = &(this->m_settings).m_mutex;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x26];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar4 = (this->m_settings).m_store.m_ints._M_elems[0x27] + iVar3;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  if (iVar4 < this->m_next_port || this->m_next_port < iVar3) {
    this->m_next_port = iVar3;
  }
  uVar2 = this->m_next_port;
  if ((int)uVar2 < iVar4) {
    iVar3 = uVar2 + 1;
  }
  this->m_next_port = iVar3;
  session_log(this," *** BINDING OUTGOING CONNECTION [ port: %d ]",(ulong)uVar2);
  return uVar2;
}

Assistant:

int session_impl::next_port() const
	{
		int start = m_settings.get_int(settings_pack::outgoing_port);
		int num = m_settings.get_int(settings_pack::num_outgoing_ports);
		std::pair<int, int> out_ports(start, start + num);
		if (m_next_port < out_ports.first || m_next_port > out_ports.second)
			m_next_port = out_ports.first;

		int port = m_next_port;
		++m_next_port;
		if (m_next_port > out_ports.second) m_next_port = out_ports.first;
#ifndef TORRENT_DISABLE_LOGGING
		session_log(" *** BINDING OUTGOING CONNECTION [ port: %d ]", port);
#endif
		return port;
	}